

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

DetectStreamRez *
METADemuxer::DetectStreamReader
          (DetectStreamRez *__return_storage_ptr__,BufferedReaderManager *readManager,
          string *fileName,bool calcDuration)

{
  pointer *this;
  size_t *psVar1;
  undefined4 containerType_00;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  TSDemuxer *pTVar7;
  ProgramStreamDemuxer *pPVar8;
  MatroskaDemuxer *this_00;
  MovDemuxer *this_01;
  reference __x;
  reference ppVar9;
  uint8_t *puVar10;
  size_t sVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  char *pcVar14;
  pointer ppVar15;
  ssize_t sVar16;
  iterator __first;
  iterator __last;
  size_t __nbytes;
  long local_d30;
  __normal_iterator<CheckStreamRez_*,_std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>_>
  local_8f0;
  const_iterator local_8e8;
  CheckStreamRez local_8e0;
  CheckStreamRez local_840;
  allocator<char> local_799;
  string local_798;
  undefined1 local_778 [8];
  CheckStreamRez trackRez_1;
  int len;
  uint8_t *tmpBuffer;
  undefined1 local_6c0 [8];
  File file;
  CheckStreamRez local_670;
  CheckStreamRez local_5d0;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  int local_4e0;
  undefined1 local_4d9;
  int i_1;
  allocator<char> local_4d4;
  allocator<char> local_4d3;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  allocator<char> local_4d0;
  allocator<char> local_4cf;
  allocator<char> local_4ce;
  allocator<char> local_4cd;
  allocator<char> local_4cc;
  allocator<char> local_4cb;
  allocator<char> local_4ca;
  allocator<char> local_4c9;
  allocator<char> local_4c8;
  allocator<char> local_4c7;
  allocator<char> local_4c6;
  allocator<char> local_4c5;
  allocator<char> local_4c4;
  allocator<char> local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  string *local_4c0;
  undefined1 local_4b1;
  allocator<char> local_4b0;
  allocator<char> local_4af;
  allocator<char> local_4ae;
  allocator<char> local_4ad;
  allocator<char> local_4ac;
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9;
  allocator<char> local_4a8;
  allocator<char> local_4a7;
  allocator<char> local_4a6;
  allocator<char> local_4a5;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  allocator<char> local_4a0;
  allocator<char> local_49f;
  allocator<char> local_49e;
  allocator<char> local_49d;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  string *local_498;
  iterator local_490;
  _Rb_tree_const_iterator<std::pair<const_int,_CLPIStreamInfo>_> local_488;
  iterator local_480;
  _Rb_tree_const_iterator<std::pair<const_int,_CLPIStreamInfo>_> local_478;
  const_iterator clpiStream;
  CheckStreamRez trackRez;
  StreamData *vect_1;
  pair<const_int,_MemoryBlock> *itr_2;
  iterator __end2_2;
  iterator __begin2_2;
  DemuxedData *__range2_2;
  uint i;
  StreamData *vect;
  pair<const_int,_MemoryBlock> *itr_1;
  iterator __end2_1;
  iterator __begin2_1;
  DemuxedData *__range2_1;
  pair<const_int,_TrackInfo> *itr;
  iterator __end2;
  iterator __begin2;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_> *__range2;
  PIDSet acceptedPidSet;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
  acceptedPidMap;
  DemuxedData demuxedData;
  int64_t discardedSize;
  undefined1 local_2a8 [4];
  uint32_t fileBlockSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  undefined1 local_220 [8];
  string clpiFileName;
  undefined1 local_1f8 [7];
  bool clpiParsed;
  CLPIParser clpi;
  undefined1 local_f0 [4];
  ContainerType containerType;
  undefined1 local_d0 [8];
  string fileExt;
  undefined1 local_a0 [8];
  string unquoted;
  AbstractDemuxer *demuxer;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> Vstreams;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> streams;
  int64_t fileDuration;
  AVChapters chapters;
  bool calcDuration_local;
  string *fileName_local;
  BufferedReaderManager *readManager_local;
  DetectStreamRez *rez;
  
  chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._7_1_ = calcDuration;
  std::vector<AVChapter,_std::allocator<AVChapter>_>::vector
            ((vector<AVChapter,_std::allocator<AVChapter>_> *)&fileDuration);
  streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::vector
            ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)
             &Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::vector
            ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)&demuxer);
  unquoted.field_2._8_8_ = 0;
  unquoteStr((string *)local_a0,fileName);
  extractFileExt((string *)local_f0,(string *)local_a0);
  strToLowerCase((string *)local_d0,(string *)local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  clpi._252_4_ = 0;
  CLPIParser::CLPIParser((CLPIParser *)local_1f8);
  clpiFileName.field_2._M_local_buf[0xf] = '\0';
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0,"m2ts");
  if (((bVar2) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_d0,"mts"), bVar2)) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"ssif"), bVar2)) {
    pTVar7 = (TSDemuxer *)operator_new(0x2390);
    TSDemuxer::TSDemuxer(pTVar7,readManager,"");
    clpi._252_4_ = 3;
    unquoted.field_2._8_8_ = pTVar7;
    extractFileDir(&local_240,(string *)local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"CLIPINF",&local_261);
    extractFileName((string *)local_2a8,(string *)local_a0);
    std::operator+(&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                   ".clpi");
    findBluRayFile((string *)local_220,&local_240,&local_260,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string((string *)&local_240);
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      pcVar14 = (char *)std::__cxx11::string::c_str();
      clpiFileName.field_2._M_local_buf[0xf] = CLPIParser::parse((CLPIParser *)local_1f8,pcVar14);
    }
    std::__cxx11::string::~string((string *)local_220);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0,"ts");
    if (bVar2) {
      pTVar7 = (TSDemuxer *)operator_new(0x2390);
      TSDemuxer::TSDemuxer(pTVar7,readManager,"");
      clpi._252_4_ = 4;
      unquoted.field_2._8_8_ = pTVar7;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"vob");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"mpg"), bVar2)) {
        pPVar8 = (ProgramStreamDemuxer *)operator_new(0x7e0);
        ProgramStreamDemuxer::ProgramStreamDemuxer(pPVar8,readManager);
        clpi._252_4_ = 2;
        unquoted.field_2._8_8_ = pPVar8;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"evo");
        if (bVar2) {
          pPVar8 = (ProgramStreamDemuxer *)operator_new(0x7e0);
          ProgramStreamDemuxer::ProgramStreamDemuxer(pPVar8,readManager);
          clpi._252_4_ = 1;
          unquoted.field_2._8_8_ = pPVar8;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"mkv");
          if (((bVar2) ||
              (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_d0,"mka"), bVar2)) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_d0,"mks"), bVar2)) {
            this_00 = (MatroskaDemuxer *)operator_new(0x8c8);
            MatroskaDemuxer::MatroskaDemuxer(this_00,readManager);
            clpi._252_4_ = 5;
            unquoted.field_2._8_8_ = this_00;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d0,"mp4");
            if ((((bVar2) ||
                 (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_d0,"m4v"), bVar2)) ||
                (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_d0,"m4a"), bVar2)) ||
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d0,"mov"), bVar2)) {
              this_01 = (MovDemuxer *)operator_new(0x470);
              MovDemuxer::MovDemuxer(this_01,readManager);
              clpi._252_4_ = 6;
              unquoted.field_2._8_8_ = this_01;
            }
          }
        }
      }
    }
  }
  if (unquoted.field_2._8_8_ == 0) {
    File::File((File *)local_6c0);
    clpi._252_4_ = 0;
    pcVar14 = (char *)std::__cxx11::string::c_str();
    __nbytes = 0;
    uVar5 = File::open((File *)local_6c0,pcVar14,1);
    if ((uVar5 & 1) == 0) {
      DetectStreamRez::DetectStreamRez(__return_storage_ptr__);
      bVar2 = true;
    }
    else {
      puVar10 = (uint8_t *)operator_new__(0x4000000);
      sVar16 = File::read((File *)local_6c0,(int)puVar10,(void *)0x4000000,__nbytes);
      trackRez_1._156_4_ = SUB84(sVar16,0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"sup");
      if (bVar2) {
        clpi._252_4_ = 7;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"pcm");
        if (((bVar2) ||
            (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d0,"lpcm"), bVar2)) ||
           ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d0,"wav"), bVar2 ||
            (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d0,"w64"), bVar2)))) {
          clpi._252_4_ = 8;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"srt");
          if (bVar2) {
            clpi._252_4_ = 9;
          }
        }
      }
      detectTrackReader((CheckStreamRez *)local_778,puVar10,trackRez_1._156_4_,clpi._252_4_,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"V_",&local_799);
      bVar2 = strStartWith((string *)((long)&trackRez_1.codecInfo.displayName.field_2 + 8),
                           &local_798);
      std::__cxx11::string::~string((string *)&local_798);
      std::allocator<char>::~allocator(&local_799);
      if (bVar2) {
        CheckStreamRez::CheckStreamRez(&local_840,(CheckStreamRez *)local_778);
        addTrack((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)&demuxer,&local_840);
        CheckStreamRez::~CheckStreamRez(&local_840);
      }
      else {
        CheckStreamRez::CheckStreamRez(&local_8e0,(CheckStreamRez *)local_778);
        addTrack((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)
                 &Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8e0);
        CheckStreamRez::~CheckStreamRez(&local_8e0);
      }
      if (puVar10 != (uint8_t *)0x0) {
        operator_delete__(puVar10);
      }
      CheckStreamRez::~CheckStreamRez((CheckStreamRez *)local_778);
      bVar2 = false;
    }
    File::~File((File *)local_6c0);
    if (bVar2) goto LAB_002e1ea8;
  }
  else {
    uVar5 = (**(code **)(*(long *)unquoted.field_2._8_8_ + 0x60))();
    (**(code **)(*(long *)unquoted.field_2._8_8_ + 0x10))(unquoted.field_2._8_8_,fileName);
    demuxedData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
    ::map((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
           *)&acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    psVar1 = &acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::map
              ((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                *)psVar1);
    (**(code **)(*(long *)unquoted.field_2._8_8_ + 0x50))(unquoted.field_2._8_8_,psVar1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
    psVar1 = &acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::
             map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
             ::begin((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                      *)psVar1);
    itr = (pair<const_int,_TrackInfo> *)
          std::
          map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
          end((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
               *)psVar1);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&itr), bVar2) {
      __x = std::_Rb_tree_iterator<std::pair<const_int,_TrackInfo>_>::operator*(&__end2);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2,&__x->first);
      std::_Rb_tree_iterator<std::pair<const_int,_TrackInfo>_>::operator++(&__end2);
    }
    psVar1 = &acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2_1 = std::
               map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
               ::begin((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                        *)psVar1);
    itr_1 = (pair<const_int,_MemoryBlock> *)
            std::
            map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
            ::end((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                   *)psVar1);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&itr_1), bVar2) {
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_int,_MemoryBlock>_>::operator*(&__end2_1);
      MemoryBlock::reserve(&ppVar9->second,uVar5);
      std::_Rb_tree_iterator<std::pair<const_int,_MemoryBlock>_>::operator++(&__end2_1);
    }
    for (__range2_2._4_4_ = 0; __range2_2._4_4_ < (uint)(0x4000000 / (ulong)uVar5);
        __range2_2._4_4_ = __range2_2._4_4_ + 1) {
      (**(code **)(*(long *)unquoted.field_2._8_8_ + 0x38))
                (unquoted.field_2._8_8_,
                 &acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_node_count,&__range2,
                 &demuxedData._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    psVar1 = &acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2_2 = std::
               map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
               ::begin((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                        *)psVar1);
    itr_2 = (pair<const_int,_MemoryBlock> *)
            std::
            map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
            ::end((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                   *)psVar1);
    while (bVar2 = std::operator!=(&__end2_2,(_Self *)&itr_2), bVar2) {
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_int,_MemoryBlock>_>::operator*(&__end2_2);
      trackRez._152_8_ = &ppVar9->second;
      puVar10 = MemoryBlock::data((MemoryBlock *)trackRez._152_8_);
      sVar11 = MemoryBlock::size((MemoryBlock *)trackRez._152_8_);
      containerType_00 = clpi._252_4_;
      pmVar12 = std::
                map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                ::operator[]((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                              *)&acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &ppVar9->first);
      detectTrackReader((CheckStreamRez *)&clpiStream,puVar10,(int)sVar11,containerType_00,
                        pmVar12->m_trackType,ppVar9->first);
      uVar13 = std::__cxx11::string::empty();
      if (((uVar13 & 1) == 0) &&
         (pcVar14 = (char *)std::__cxx11::string::operator[]
                                      ((ulong)((long)&trackRez.codecInfo.displayName.field_2 + 8)),
         *pcVar14 != 'S')) {
        trackRez._136_8_ =
             (**(code **)(*(long *)unquoted.field_2._8_8_ + 0x68))
                       (unquoted.field_2._8_8_,ppVar9->first);
      }
      trackRez.lang.field_2._8_4_ = ppVar9->first;
      pmVar12 = std::
                map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                ::operator[]((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                              *)&acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type_conflict *)(trackRez.lang.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=
                ((string *)(trackRez.streamDescr.field_2._M_local_buf + 8),
                 (string *)&pmVar12->m_lang);
      if ((clpiFileName.field_2._M_local_buf[0xf] & 1U) != 0) {
        local_480._M_node =
             (_Base_ptr)
             std::
             map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
             ::find((map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
                     *)(clpi.version_number + 3),&ppVar9->first);
        std::_Rb_tree_const_iterator<std::pair<const_int,_CLPIStreamInfo>_>::_Rb_tree_const_iterator
                  (&local_478,&local_480);
        local_490._M_node =
             (_Base_ptr)
             std::
             map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
             ::end((map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
                    *)(clpi.version_number + 3));
        std::_Rb_tree_const_iterator<std::pair<const_int,_CLPIStreamInfo>_>::_Rb_tree_const_iterator
                  (&local_488,&local_490);
        bVar2 = std::operator!=(&local_478,&local_488);
        if (bVar2) {
          ppVar15 = std::_Rb_tree_const_iterator<std::pair<const_int,_CLPIStreamInfo>_>::operator->
                              (&local_478);
          std::__cxx11::string::operator=
                    ((string *)(trackRez.streamDescr.field_2._M_local_buf + 8),
                     (ppVar15->second).super_M2TSStreamInfo.language_code);
        }
      }
      if ((DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
           langB_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                       ::langB_abi_cxx11_), iVar6 != 0)) {
        local_4b1 = 1;
        local_498 = DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                   ::langB_abi_cxx11_,"alb",&local_499);
        local_498 = (string *)0x44aab0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 1),"arm",&local_49a);
        local_498 = (string *)0x44aad0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 2),"baq",&local_49b);
        local_498 = (string *)0x44aaf0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 3),"bur",&local_49c);
        local_498 = (string *)0x44ab10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 4),"cze",&local_49d);
        local_498 = (string *)0x44ab30;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 5),"chi",&local_49e);
        local_498 = (string *)0x44ab50;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 6),"dut",&local_49f);
        local_498 = (string *)0x44ab70;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 7),"ger",&local_4a0);
        local_498 = (string *)0x44ab90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 8),"gre",&local_4a1);
        local_498 = (string *)0x44abb0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 9),"fre",&local_4a2);
        local_498 = (string *)0x44abd0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 10),"geo",&local_4a3);
        local_498 = (string *)0x44abf0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0xb),"ice",&local_4a4);
        local_498 = (string *)0x44ac10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0xc),"jaw",&local_4a5);
        local_498 = (string *)0x44ac30;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0xd),"mac",&local_4a6);
        local_498 = (string *)0x44ac50;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0xe),"mao",&local_4a7);
        local_498 = (string *)0x44ac70;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0xf),"may",&local_4a8);
        local_498 = (string *)0x44ac90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x10),"mol",&local_4a9);
        local_498 = (string *)0x44acb0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x11),"per",&local_4aa);
        local_498 = (string *)0x44acd0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x12),"rum",&local_4ab);
        local_498 = (string *)0x44acf0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x13),"scc",&local_4ac);
        local_498 = (string *)0x44ad10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x14),"scr",&local_4ad);
        local_498 = (string *)0x44ad30;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x15),"slo",&local_4ae);
        local_498 = (string *)0x44ad50;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x16),"tib",&local_4af);
        local_498 = (string *)0x44ad70;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langB_abi_cxx11_ + 0x17),"wel",&local_4b0);
        local_4b1 = 0;
        std::allocator<char>::~allocator(&local_4b0);
        std::allocator<char>::~allocator(&local_4af);
        std::allocator<char>::~allocator(&local_4ae);
        std::allocator<char>::~allocator(&local_4ad);
        std::allocator<char>::~allocator(&local_4ac);
        std::allocator<char>::~allocator(&local_4ab);
        std::allocator<char>::~allocator(&local_4aa);
        std::allocator<char>::~allocator(&local_4a9);
        std::allocator<char>::~allocator(&local_4a8);
        std::allocator<char>::~allocator(&local_4a7);
        std::allocator<char>::~allocator(&local_4a6);
        std::allocator<char>::~allocator(&local_4a5);
        std::allocator<char>::~allocator(&local_4a4);
        std::allocator<char>::~allocator(&local_4a3);
        std::allocator<char>::~allocator(&local_4a2);
        std::allocator<char>::~allocator(&local_4a1);
        std::allocator<char>::~allocator(&local_4a0);
        std::allocator<char>::~allocator(&local_49f);
        std::allocator<char>::~allocator(&local_49e);
        std::allocator<char>::~allocator(&local_49d);
        std::allocator<char>::~allocator(&local_49c);
        std::allocator<char>::~allocator(&local_49b);
        std::allocator<char>::~allocator(&local_49a);
        std::allocator<char>::~allocator(&local_499);
        __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
        __cxa_guard_release(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                             ::langB_abi_cxx11_);
      }
      if ((DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
           langT_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                       ::langT_abi_cxx11_), iVar6 != 0)) {
        local_4d9 = 1;
        local_4c0 = DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                   ::langT_abi_cxx11_,"sqi",&local_4c1);
        local_4c0 = (string *)0x44adc0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 1),"hye",&local_4c2);
        local_4c0 = (string *)0x44ade0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 2),"eus",&local_4c3);
        local_4c0 = (string *)0x44ae00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 3),"mya",&local_4c4);
        local_4c0 = (string *)0x44ae20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 4),"ces",&local_4c5);
        local_4c0 = (string *)0x44ae40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 5),"zho",&local_4c6);
        local_4c0 = (string *)0x44ae60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 6),"nld",&local_4c7);
        local_4c0 = (string *)0x44ae80;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 7),"deu",&local_4c8);
        local_4c0 = (string *)0x44aea0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 8),"ell",&local_4c9);
        local_4c0 = (string *)0x44aec0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 9),"fra",&local_4ca);
        local_4c0 = (string *)0x44aee0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 10),"kat",&local_4cb);
        local_4c0 = (string *)0x44af00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0xb),"isl",&local_4cc);
        local_4c0 = (string *)0x44af20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0xc),"jav",&local_4cd);
        local_4c0 = (string *)0x44af40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0xd),"mkd",&local_4ce);
        local_4c0 = (string *)0x44af60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0xe),"mri",&local_4cf);
        local_4c0 = (string *)0x44af80;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0xf),"fas",&local_4d0);
        local_4c0 = (string *)0x44afa0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x10),"rom",&local_4d1);
        local_4c0 = (string *)0x44afc0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x11),"msa",&local_4d2);
        local_4c0 = (string *)0x44afe0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x12),"ron",&local_4d3);
        local_4c0 = (string *)0x44b000;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x13),"srp",&local_4d4);
        local_4c0 = (string *)0x44b020;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x14),"hrv",(allocator<char> *)((long)&i_1 + 3));
        local_4c0 = (string *)0x44b040;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x15),"slk",(allocator<char> *)((long)&i_1 + 2));
        local_4c0 = (string *)0x44b060;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x16),"bod",(allocator<char> *)((long)&i_1 + 1));
        local_4c0 = (string *)0x44b080;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                    ::langT_abi_cxx11_ + 0x17),"cym",(allocator<char> *)&i_1);
        local_4d9 = 0;
        std::allocator<char>::~allocator((allocator<char> *)&i_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 2));
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
        std::allocator<char>::~allocator(&local_4d4);
        std::allocator<char>::~allocator(&local_4d3);
        std::allocator<char>::~allocator(&local_4d2);
        std::allocator<char>::~allocator(&local_4d1);
        std::allocator<char>::~allocator(&local_4d0);
        std::allocator<char>::~allocator(&local_4cf);
        std::allocator<char>::~allocator(&local_4ce);
        std::allocator<char>::~allocator(&local_4cd);
        std::allocator<char>::~allocator(&local_4cc);
        std::allocator<char>::~allocator(&local_4cb);
        std::allocator<char>::~allocator(&local_4ca);
        std::allocator<char>::~allocator(&local_4c9);
        std::allocator<char>::~allocator(&local_4c8);
        std::allocator<char>::~allocator(&local_4c7);
        std::allocator<char>::~allocator(&local_4c6);
        std::allocator<char>::~allocator(&local_4c5);
        std::allocator<char>::~allocator(&local_4c4);
        std::allocator<char>::~allocator(&local_4c3);
        std::allocator<char>::~allocator(&local_4c2);
        std::allocator<char>::~allocator(&local_4c1);
        __cxa_atexit(__cxx_global_array_dtor_163,0,&__dso_handle);
        __cxa_guard_release(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                             ::langT_abi_cxx11_);
      }
      for (local_4e0 = 0; local_4e0 < 0x18; local_4e0 = local_4e0 + 1) {
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&trackRez.streamDescr.field_2 + 8),
                                DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                ::langB_abi_cxx11_ + local_4e0);
        if (_Var3) {
          std::__cxx11::string::operator=
                    ((string *)(trackRez.streamDescr.field_2._M_local_buf + 8),
                     (string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + local_4e0));
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"A_",&local_501);
      bVar4 = strStartWith((string *)((long)&trackRez.codecInfo.displayName.field_2 + 8),&local_500)
      ;
      bVar2 = false;
      if (bVar4) {
        if (unquoted.field_2._8_8_ == 0) {
          local_d30 = 0;
        }
        else {
          local_d30 = __dynamic_cast(unquoted.field_2._8_8_,&AbstractDemuxer::typeinfo,
                                     &TSDemuxer::typeinfo,0);
        }
        bVar2 = local_d30 != 0;
      }
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
      if ((bVar2) && (0x19ff < (int)trackRez.lang.field_2._8_4_)) {
        trackRez.delay._1_1_ = 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"V_",&local_529);
      bVar2 = strStartWith((string *)((long)&trackRez.codecInfo.displayName.field_2 + 8),&local_528)
      ;
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator(&local_529);
      if (bVar2) {
        CheckStreamRez::CheckStreamRez(&local_5d0,(CheckStreamRez *)&clpiStream);
        addTrack((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)&demuxer,&local_5d0);
        CheckStreamRez::~CheckStreamRez(&local_5d0);
      }
      else {
        CheckStreamRez::CheckStreamRez(&local_670,(CheckStreamRez *)&clpiStream);
        addTrack((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)
                 &Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_670);
        CheckStreamRez::~CheckStreamRez(&local_670);
      }
      CheckStreamRez::~CheckStreamRez((CheckStreamRez *)&clpiStream);
      std::_Rb_tree_iterator<std::pair<const_int,_MemoryBlock>_>::operator++(&__end2_2);
    }
    (**(code **)(*(long *)unquoted.field_2._8_8_ + 0x70))(&file.m_pos);
    std::vector<AVChapter,_std::allocator<AVChapter>_>::operator=
              ((vector<AVChapter,_std::allocator<AVChapter>_> *)&fileDuration,
               (vector<AVChapter,_std::allocator<AVChapter>_> *)&file.m_pos);
    std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector
              ((vector<AVChapter,_std::allocator<AVChapter>_> *)&file.m_pos);
    if ((chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(**(code **)(*(long *)unquoted.field_2._8_8_ + 0x88))();
    }
    if (unquoted.field_2._8_8_ != 0) {
      (**(code **)(*(long *)unquoted.field_2._8_8_ + 8))();
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
    std::map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
    ~map((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_> *)
         &acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
    ::~map((map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
            *)&acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  local_8f0._M_current =
       (CheckStreamRez *)
       std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::end
                 ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)&demuxer);
  __gnu_cxx::
  __normal_iterator<CheckStreamRez_const*,std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>>
  ::__normal_iterator<CheckStreamRez*>
            ((__normal_iterator<CheckStreamRez_const*,std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>>
              *)&local_8e8,&local_8f0);
  this = &Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  __first = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::begin
                      ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this);
  __last = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::end
                     ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this);
  std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>::
  insert<__gnu_cxx::__normal_iterator<CheckStreamRez*,std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>>,void>
            ((vector<CheckStreamRez,std::allocator<CheckStreamRez>> *)&demuxer,local_8e8,
             (__normal_iterator<CheckStreamRez_*,_std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>_>
              )__first._M_current,
             (__normal_iterator<CheckStreamRez_*,_std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>_>
              )__last._M_current);
  DetectStreamRez::DetectStreamRez(__return_storage_ptr__);
  std::vector<AVChapter,_std::allocator<AVChapter>_>::operator=
            (&__return_storage_ptr__->chapters,
             (vector<AVChapter,_std::allocator<AVChapter>_> *)&fileDuration);
  __return_storage_ptr__->fileDurationNano =
       (int64_t)streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator=
            (&__return_storage_ptr__->streams,
             (vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)&demuxer);
LAB_002e1ea8:
  CLPIParser::~CLPIParser((CLPIParser *)local_1f8);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_a0);
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector
            ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)&demuxer);
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector
            ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)
             &Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector
            ((vector<AVChapter,_std::allocator<AVChapter>_> *)&fileDuration);
  return __return_storage_ptr__;
}

Assistant:

DetectStreamRez METADemuxer::DetectStreamReader(const BufferedReaderManager& readManager, const string& fileName,
                                                bool calcDuration)
{
    AVChapters chapters;
    int64_t fileDuration = 0;
    vector<CheckStreamRez> streams, Vstreams;
    AbstractDemuxer* demuxer = nullptr;
    auto unquoted = unquoteStr(fileName);
    string fileExt = strToLowerCase(extractFileExt(unquoted));
    AbstractStreamReader::ContainerType containerType = AbstractStreamReader::ContainerType::ctNone;
    CLPIParser clpi;
    bool clpiParsed = false;
    if (fileExt == "m2ts" || fileExt == "mts" || fileExt == "ssif")
    {
        demuxer = new TSDemuxer(readManager, "");
        containerType = AbstractStreamReader::ContainerType::ctM2TS;
        string clpiFileName = findBluRayFile(extractFileDir(unquoted), "CLIPINF", extractFileName(unquoted) + ".clpi");
        if (!clpiFileName.empty())
            clpiParsed = clpi.parse(clpiFileName.c_str());
    }
    else if (fileExt == "ts")
    {
        demuxer = new TSDemuxer(readManager, "");
        containerType = AbstractStreamReader::ContainerType::ctTS;
    }
    else if (fileExt == "vob" || fileExt == "mpg")
    {
        demuxer = new ProgramStreamDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctVOB;
    }
    else if (fileExt == "evo")
    {
        demuxer = new ProgramStreamDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctEVOB;
    }
    else if (fileExt == "mkv" || fileExt == "mka" || fileExt == "mks")
    {
        demuxer = new MatroskaDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctMKV;
    }
    else if (fileExt == "mp4" || fileExt == "m4v" || fileExt == "m4a" || fileExt == "mov")
    {
        demuxer = new MovDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctMOV;
    }

    if (demuxer)
    {
        uint32_t fileBlockSize = demuxer->getFileBlockSize();

        demuxer->openFile(fileName);
        int64_t discardedSize = 0;
        DemuxedData demuxedData;
        map<int32_t, TrackInfo> acceptedPidMap;
        demuxer->getTrackList(acceptedPidMap);
        PIDSet acceptedPidSet;
        for (const auto& itr : acceptedPidMap) acceptedPidSet.insert(itr.first);
        for (auto& itr : demuxedData)
        {
            StreamData& vect = itr.second;
            vect.reserve(fileBlockSize);
        }

        for (unsigned i = 0; i < DETECT_STREAM_BUFFER_SIZE / fileBlockSize; i++)
            demuxer->simpleDemuxBlock(demuxedData, acceptedPidSet, discardedSize);

        for (auto& itr : demuxedData)
        {
            StreamData& vect = itr.second;
            CheckStreamRez trackRez = detectTrackReader(vect.data(), static_cast<int>(vect.size()), containerType,
                                                        acceptedPidMap[itr.first].m_trackType, itr.first);
            if (!trackRez.codecInfo.programName.empty())
            {
                if (trackRez.codecInfo.programName[0] != 'S')
                    trackRez.delay = demuxer->getTrackDelay(itr.first);
            }
            trackRez.trackID = itr.first;
            trackRez.lang = acceptedPidMap[trackRez.trackID].m_lang;
            if (clpiParsed)
            {
                map<int, CLPIStreamInfo>::const_iterator clpiStream = clpi.m_streamInfo.find(itr.first);
                if (clpiStream != clpi.m_streamInfo.end())
                    trackRez.lang = clpiStream->second.language_code;
            }
            // correct ISO 639-2/B codes to ISO 639-2/T
            static const std::string langB[24] = {
                "alb", "arm", "baq", "bur", "cze", "chi", "dut", "ger", "gre", "fre", "geo", "ice",
                "jaw", "mac", "mao", "may", "mol", "per", "rum", "scc", "scr", "slo", "tib", "wel",
            };
            static const std::string langT[24] = {
                "sqi", "hye", "eus", "mya", "ces", "zho", "nld", "deu", "ell", "fra", "kat", "isl",
                "jav", "mkd", "mri", "fas", "rom", "msa", "ron", "srp", "hrv", "slk", "bod", "cym",
            };
            for (int i = 0; i < 24; i++)
                if (trackRez.lang == langB[i])
                    trackRez.lang = langT[i];

            if (strStartWith(trackRez.codecInfo.programName, "A_") && dynamic_cast<TSDemuxer*>(demuxer))
            {
                if (trackRez.trackID >= 0x1A00)
                    trackRez.isSecondary = true;
            }

            if (strStartWith(trackRez.codecInfo.programName, "V_"))
                addTrack(Vstreams, trackRez);
            else
                addTrack(streams, trackRez);
        }
        chapters = demuxer->getChapters();
        if (calcDuration)
            fileDuration = demuxer->getFileDurationNano();
        delete demuxer;
    }
    else
    {
        File file;
        containerType = AbstractStreamReader::ContainerType::ctNone;
        if (!file.open(fileName.c_str(), File::ofRead))
            return {};
        auto tmpBuffer = new uint8_t[DETECT_STREAM_BUFFER_SIZE];
        int len = file.read(tmpBuffer, DETECT_STREAM_BUFFER_SIZE);
        if (fileExt == "sup")
            containerType = AbstractStreamReader::ContainerType::ctSUP;
        else if (fileExt == "pcm" || fileExt == "lpcm" || fileExt == "wav" || fileExt == "w64")
            containerType = AbstractStreamReader::ContainerType::ctLPCM;
        else if (fileExt == "srt")
            containerType = AbstractStreamReader::ContainerType::ctSRT;
        CheckStreamRez trackRez = detectTrackReader(tmpBuffer, len, containerType, 0, 0);

        if (strStartWith(trackRez.codecInfo.programName, "V_"))
            addTrack(Vstreams, trackRez);
        else
            addTrack(streams, trackRez);

        delete[] tmpBuffer;
    }
    Vstreams.insert(Vstreams.end(), streams.begin(), streams.end());

    DetectStreamRez rez;
    rez.chapters = chapters;
    rez.fileDurationNano = fileDuration;
    rez.streams = Vstreams;
    return rez;
}